

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::ObjFileImporter::createTopology
          (ObjFileImporter *this,Model *pModel,Object *pData,uint meshIndex)

{
  Mesh *pMVar1;
  size_t __n;
  Face *pFVar2;
  uint uVar3;
  aiMesh *pMesh_00;
  ulong uVar4;
  ulong *puVar5;
  pointer ppFVar6;
  uint *puVar7;
  uint uVar8;
  aiFace *paVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ObjFileImporter *this_00;
  uint uVar13;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> pMesh;
  
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x13c,
                  "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                 );
  }
  if (((pData == (Object *)0x0) ||
      (pMVar1 = (pModel->m_Meshes).
                super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>
                ._M_impl.super__Vector_impl_data._M_start[meshIndex], pMVar1 == (Mesh *)0x0)) ||
     ((pMVar1->m_Faces).
      super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(pMVar1->m_Faces).
               super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
               ._M_impl + 8))) {
    return (aiMesh *)0x0;
  }
  pMesh_00 = (aiMesh *)operator_new(0x520);
  pMesh_00->mPrimitiveTypes = 0;
  pMesh_00->mNumVertices = 0;
  pMesh_00->mNumFaces = 0;
  memset(&pMesh_00->mVertices,0,0xcc);
  pMesh_00->mBones = (aiBone **)0x0;
  pMesh_00->mMaterialIndex = 0;
  (pMesh_00->mName).length = 0;
  (pMesh_00->mName).data[0] = '\0';
  memset((pMesh_00->mName).data + 1,0x1b,0x3ff);
  pMesh_00->mNumAnimMeshes = 0;
  pMesh_00->mAnimMeshes = (aiAnimMesh **)0x0;
  pMesh_00->mMethod = 0;
  (pMesh_00->mAABB).mMin.x = 0.0;
  (pMesh_00->mAABB).mMin.y = 0.0;
  (pMesh_00->mAABB).mMin.z = 0.0;
  (pMesh_00->mAABB).mMax.x = 0.0;
  (pMesh_00->mAABB).mMax.y = 0.0;
  (pMesh_00->mAABB).mMax.z = 0.0;
  this_00 = (ObjFileImporter *)pMesh_00->mColors;
  memset(this_00,0,0xa0);
  __n = (pMVar1->m_name)._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (pMesh_00->mName).length = (ai_uint32)__n;
    this_00 = (ObjFileImporter *)(pMesh_00->mName).data;
    memcpy(this_00,(pMVar1->m_name)._M_dataplus._M_p,__n);
    (pMesh_00->mName).data[__n] = '\0';
  }
  ppFVar6 = (pMVar1->m_Faces).
            super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pMVar1->m_Faces).
               super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
               ._M_impl + 8) != ppFVar6) {
    uVar4 = 0;
    do {
      pFVar2 = ppFVar6[uVar4];
      if (pFVar2 == (Face *)0x0) {
        __assert_fail("__null != inp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Obj/ObjFileImporter.cpp"
                      ,0x154,
                      "aiMesh *Assimp::ObjFileImporter::createTopology(const ObjFile::Model *, const ObjFile::Object *, unsigned int)"
                     );
      }
      if (pFVar2->m_PrimitiveType == aiPrimitiveType_POINT) {
        pMesh_00->mNumFaces =
             pMesh_00->mNumFaces +
             (int)((ulong)((long)*(pointer *)
                                  ((long)&(pFVar2->m_vertices).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl + 8) -
                          *(long *)&(pFVar2->m_vertices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data) >> 2);
        uVar8 = pMesh_00->mPrimitiveTypes | 1;
      }
      else if (pFVar2->m_PrimitiveType == aiPrimitiveType_LINE) {
        pMesh_00->mNumFaces =
             ((int)((ulong)((long)*(pointer *)
                                   ((long)&(pFVar2->m_vertices).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl + 8) -
                           *(long *)&(pFVar2->m_vertices).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data) >> 2) + pMesh_00->mNumFaces)
             - 1;
        uVar8 = pMesh_00->mPrimitiveTypes | 2;
      }
      else {
        pMesh_00->mNumFaces = pMesh_00->mNumFaces + 1;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pFVar2->m_vertices).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl + 8) -
                   *(long *)&(pFVar2->m_vertices).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data) < 0xd) {
          uVar8 = pMesh_00->mPrimitiveTypes | 4;
        }
        else {
          uVar8 = pMesh_00->mPrimitiveTypes | 8;
        }
      }
      pMesh_00->mPrimitiveTypes = uVar8;
      uVar4 = uVar4 + 1;
      ppFVar6 = (pMVar1->m_Faces).
                super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)*(pointer *)
                                    ((long)&(pMVar1->m_Faces).
                                            super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                            ._M_impl + 8) - (long)ppFVar6 >> 3));
  }
  uVar4 = (ulong)pMesh_00->mNumFaces;
  uVar8 = 0;
  if (uVar4 != 0) {
    this_00 = (ObjFileImporter *)(uVar4 * 0x10 + 8);
    puVar5 = (ulong *)operator_new__((ulong)this_00);
    *puVar5 = uVar4;
    paVar9 = (aiFace *)(puVar5 + 1);
    do {
      paVar9->mNumIndices = 0;
      paVar9->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    } while (paVar9 != (aiFace *)(puVar5 + uVar4 * 2 + 1));
    pMesh_00->mFaces = (aiFace *)(puVar5 + 1);
    if (pMVar1->m_uiMaterialIndex != 0xffffffff) {
      pMesh_00->mMaterialIndex = pMVar1->m_uiMaterialIndex;
    }
    ppFVar6 = (pMVar1->m_Faces).
              super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&(pMVar1->m_Faces).
                 super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                 ._M_impl + 8) != ppFVar6) {
      uVar4 = 0;
      uVar12 = 0;
      uVar8 = 0;
      do {
        pFVar2 = ppFVar6[uVar4];
        uVar13 = uVar12;
        if (pFVar2->m_PrimitiveType == aiPrimitiveType_LINE) {
          if ((long)*(pointer *)
                     ((long)&(pFVar2->m_vertices).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     + 8) -
              *(long *)&(pFVar2->m_vertices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data != 4) {
            uVar11 = 0;
            do {
              uVar13 = uVar12 + (int)uVar11;
              paVar9 = pMesh_00->mFaces;
              paVar9[uVar13].mNumIndices = 2;
              this_00 = (ObjFileImporter *)0x8;
              puVar7 = (uint *)operator_new__(8);
              uVar8 = uVar8 + 2;
              paVar9[uVar13].mIndices = puVar7;
              uVar11 = uVar11 + 1;
            } while (uVar11 < ((long)*(pointer *)
                                      ((long)&(pFVar2->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl + 8) -
                               *(long *)&(pFVar2->m_vertices).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data >> 2) - 1U);
            iVar10 = (int)uVar11;
LAB_00460f1b:
            uVar13 = uVar12 + iVar10;
          }
        }
        else if (pFVar2->m_PrimitiveType == aiPrimitiveType_POINT) {
          if (*(pointer *)
               ((long)&(pFVar2->m_vertices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
              != (pFVar2->m_vertices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
            uVar11 = 0;
            do {
              uVar13 = uVar12 + (int)uVar11;
              paVar9 = pMesh_00->mFaces;
              paVar9[uVar13].mNumIndices = 1;
              this_00 = (ObjFileImporter *)0x4;
              puVar7 = (uint *)operator_new__(4);
              paVar9[uVar13].mIndices = puVar7;
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)*(pointer *)
                                             ((long)&(pFVar2->m_vertices).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                      *(long *)&(pFVar2->m_vertices).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data >> 2));
            iVar10 = (int)uVar11;
            uVar8 = uVar8 + iVar10;
            goto LAB_00460f1b;
          }
        }
        else {
          paVar9 = pMesh_00->mFaces;
          this_00 = (ObjFileImporter *)
                    ((long)*(pointer *)
                            ((long)&(pFVar2->m_vertices).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + 8) -
                    *(long *)&(pFVar2->m_vertices).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data);
          uVar3 = (uint)((ulong)this_00 >> 2);
          paVar9[uVar12].mNumIndices = uVar3;
          uVar8 = uVar8 + uVar3;
          uVar13 = uVar12 + 1;
          if (uVar3 != 0) {
            this_00 = (ObjFileImporter *)((ulong)this_00 & 0x3fffffffc);
            puVar7 = (uint *)operator_new__((ulong)this_00);
            paVar9[uVar12].mIndices = puVar7;
          }
        }
        uVar12 = uVar13;
        uVar4 = uVar4 + 1;
        ppFVar6 = (pMVar1->m_Faces).
                  super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)*(pointer *)
                                      ((long)&(pMVar1->m_Faces).
                                              super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                              ._M_impl + 8) - (long)ppFVar6 >> 3));
    }
  }
  createVertexArray(this_00,pModel,pData,meshIndex,pMesh_00,uVar8);
  return pMesh_00;
}

Assistant:

aiMesh *ObjFileImporter::createTopology( const ObjFile::Model* pModel, const ObjFile::Object* pData, unsigned int meshIndex ) {
    // Checking preconditions
    ai_assert( NULL != pModel );

    if( NULL == pData ) {
        return NULL;
    }

    // Create faces
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ meshIndex ];
    if( !pObjMesh ) {
        return NULL;
    }

    if( pObjMesh->m_Faces.empty() ) {
        return NULL;
    }

    std::unique_ptr<aiMesh> pMesh(new aiMesh);
    if( !pObjMesh->m_name.empty() ) {
        pMesh->mName.Set( pObjMesh->m_name );
    }

    for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++)
    {
        ObjFile::Face *const inp = pObjMesh->m_Faces[ index ];
        ai_assert( NULL != inp  );

        if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size() - 1);
            pMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
        } else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
            pMesh->mNumFaces += static_cast<unsigned int>(inp->m_vertices.size());
            pMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
        } else {
            ++pMesh->mNumFaces;
            if (inp->m_vertices.size() > 3) {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            }
        }
    }

    unsigned int uiIdxCount( 0u );
    if ( pMesh->mNumFaces > 0 ) {
        pMesh->mFaces = new aiFace[ pMesh->mNumFaces ];
        if ( pObjMesh->m_uiMaterialIndex != ObjFile::Mesh::NoMaterial ) {
            pMesh->mMaterialIndex = pObjMesh->m_uiMaterialIndex;
        }

        unsigned int outIndex( 0 );

        // Copy all data from all stored meshes
        for (size_t index = 0; index < pObjMesh->m_Faces.size(); index++) {
            ObjFile::Face* const inp = pObjMesh->m_Faces[ index ];
            if (inp->m_PrimitiveType == aiPrimitiveType_LINE) {
                for(size_t i = 0; i < inp->m_vertices.size() - 1; ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 2;
                    f.mIndices = new unsigned int[2];
                }
                continue;
            }
            else if (inp->m_PrimitiveType == aiPrimitiveType_POINT) {
                for(size_t i = 0; i < inp->m_vertices.size(); ++i) {
                    aiFace& f = pMesh->mFaces[ outIndex++ ];
                    uiIdxCount += f.mNumIndices = 1;
                    f.mIndices = new unsigned int[1];
                }
                continue;
            }

            aiFace *pFace = &pMesh->mFaces[ outIndex++ ];
            const unsigned int uiNumIndices = (unsigned int) pObjMesh->m_Faces[ index ]->m_vertices.size();
            uiIdxCount += pFace->mNumIndices = (unsigned int) uiNumIndices;
            if (pFace->mNumIndices > 0) {
                pFace->mIndices = new unsigned int[ uiNumIndices ];
            }
        }
    }

    // Create mesh vertices
    createVertexArray(pModel, pData, meshIndex, pMesh.get(), uiIdxCount);

    return pMesh.release();
}